

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall testing::Matcher<SDL_Window_*>::Matcher(Matcher<SDL_Window_*> *this,Snapshot *value)

{
  MatcherBase<SDL_Window_*> local_28;
  
  (this->super_MatcherBase<SDL_Window_*>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<SDL_Window_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_002f8ff8;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<SDL_Window*>::
       GetVTable<testing::internal::MatcherBase<SDL_Window*>::ValuePolicy<testing::internal::EqMatcher<SDL_Window*>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f8ff8;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<SDL_Window_*>::operator=(&this->super_MatcherBase<SDL_Window_*>,&local_28);
  internal::MatcherBase<SDL_Window_*>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }